

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ImplicitTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitTypeSyntax,slang::syntax::ImplicitTypeSyntax_const&>
          (BumpAllocator *this,ImplicitTypeSyntax *args)

{
  ImplicitTypeSyntax *pIVar1;
  ImplicitTypeSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pIVar1 = (ImplicitTypeSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ImplicitTypeSyntax::ImplicitTypeSyntax(in_RSI,pIVar1);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }